

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

print * __thiscall
lest::for_test<lest::print>(lest *this,tests *specification,texts *in,print *perform,int n)

{
  long *plVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  int iVar5;
  fd_set *__exceptfds;
  int iVar6;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  long *plVar7;
  long *local_b0 [2];
  long local_a0 [2];
  lest *local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  _Any_data local_68;
  code *local_58;
  
  iVar5 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar5 < 1);
  if (iVar5 == -1 || iVar5 >= 1) {
    iVar6 = 0;
    local_90 = this;
    do {
      plVar1 = *(long **)(local_90 + 8);
      for (plVar7 = *(long **)local_90; plVar7 != plVar1; plVar7 = plVar7 + 8) {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>((string *)local_b0,*plVar7,plVar7[1] + *plVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)specification);
        iVar2 = select((int)(string *)local_b0,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if ((char)iVar2 != '\0') {
          local_88 = local_78;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar7,plVar7[1] + *plVar7)
          ;
          std::function<void_(lest::env_&)>::function
                    ((function<void_(lest::env_&)> *)&local_68,
                     (function<void_(lest::env_&)> *)(plVar7 + 4));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)
                              (in->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,(char *)local_88,local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if (local_58 != (code *)0x0) {
            (*local_58)(&local_68,&local_68,__destroy_functor);
          }
          if (local_88 != local_78) {
            operator_delete(local_88,local_78[0] + 1);
          }
        }
      }
      iVar6 = iVar6 + 1;
      bVar4 = iVar6 < iVar5 || iVar5 == -1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),bVar4);
    } while (bVar4);
  }
  return (print *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}